

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

int Au_ManFindNtk(Au_Man_t *p,char *pName)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(p->vNtks).nSize;
  if (1 < (long)uVar4) {
    uVar1 = (p->vNtks).nSize;
    uVar5 = 1;
    if (1 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 1;
    do {
      if (uVar5 == uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = strcmp(*(p->vNtks).pArray[uVar3],pName);
      if (iVar2 == 0) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return -1;
}

Assistant:

int Au_ManFindNtk( Au_Man_t * p, char * pName )
{
    Au_Ntk_t * pNtk;
    int i;
    Au_ManForEachNtk( p, pNtk, i )
        if ( !strcmp(Au_NtkName(pNtk), pName) )
            return i;
    return -1;
}